

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue this_val_00;
  JSValue this_val_01;
  JSValue this_val_02;
  JSValue this_val_03;
  JSValue val_00;
  JSValue val_01;
  JSValue prop;
  JSValue this_obj;
  JSValue prop_00;
  JSValue this_obj_00;
  JSValue val_02;
  JSValue this_val_04;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  JSObject *p_00;
  JSObject *p_01;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar11;
  int shift;
  int count;
  int final;
  int start;
  int len;
  int n;
  JSObject *p1;
  JSObject *p;
  JSValue val;
  JSValue arr;
  JSValue args [2];
  JSContext *in_stack_fffffffffffffe80;
  JSContext *pJVar12;
  JSContext *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  JSContext *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int *in_stack_fffffffffffffea8;
  JSContext *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 uVar14;
  int in_stack_fffffffffffffed0;
  undefined4 uVar15;
  JSValueUnion ctx_00;
  JSValueUnion JVar16;
  int64_t iVar17;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffef4;
  int64_t iVar19;
  byte bVar20;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff14;
  JSValueUnion in_stack_ffffffffffffff18;
  undefined4 local_70;
  int iStack_6c;
  JSValueUnion local_68;
  int iStack_4c;
  undefined4 uStack_c;
  
  uVar18 = 0;
  iVar19 = 3;
  JVar11.u._4_4_ = in_stack_fffffffffffffe94;
  JVar11.u.int32 = in_stack_fffffffffffffe90;
  JVar11.tag = (int64_t)in_stack_fffffffffffffe98;
  iVar2 = js_typed_array_get_length_internal(in_stack_fffffffffffffe88,JVar11);
  if (((-1 < iVar2) &&
      (val_00.tag._0_4_ = in_stack_fffffffffffffec0,
      val_00.u.ptr = (void *)in_stack_fffffffffffffeb8, val_00.tag._4_4_ = in_stack_fffffffffffffec4
      , iVar3 = JS_ToInt32Clamp(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,val_00,
                                in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                                in_stack_fffffffffffffed0), iVar3 == 0)) &&
     ((iVar3 = iVar2, iVar4 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x10)), iVar4 != 0 ||
      (val_01.tag._0_4_ = in_stack_fffffffffffffec0,
      val_01.u.ptr = (void *)in_stack_fffffffffffffeb8, val_01.tag._4_4_ = in_stack_fffffffffffffec4
      , iVar4 = JS_ToInt32Clamp(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,val_01,
                                in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                                in_stack_fffffffffffffed0), iVar4 == 0)))) {
    uVar5 = max_int(iVar2 - in_stack_ffffffffffffff0c,0);
    this_val_02.u._4_4_ = in_stack_fffffffffffffea4;
    this_val_02.u.int32 = in_stack_fffffffffffffea0;
    this_val_02.tag = (int64_t)in_stack_fffffffffffffea8;
    p_00 = get_typed_array(in_stack_fffffffffffffe98,this_val_02,in_stack_fffffffffffffe94);
    if (p_00 != (JSObject *)0x0) {
      uVar6 = (uint)(byte)"includes"[(ulong)(p_00->field_0).header.dummy2 + 1];
      JVar16._4_4_ = uStack_c;
      JVar16.int32 = uVar5;
      iVar17 = 0;
      uVar13 = 0;
      uVar14 = 3;
      this_val_04.tag = (int64_t)p_00;
      this_val_04.u.float64 = in_stack_ffffffffffffff18.float64;
      JVar11 = js_typed_array___speciesCreate
                         ((JSContext *)CONCAT44(in_stack_ffffffffffffff14,iVar3),this_val_04,
                          in_stack_ffffffffffffff0c,(JSValue *)CONCAT44(uVar5,uVar6));
      bVar20 = (byte)uVar6;
      local_70 = JVar11.u._0_4_;
      iVar4 = JVar11.u._4_4_;
      local_68 = (JSValueUnion)JVar11.tag;
      uVar15 = local_70;
      iVar2 = iVar4;
      ctx_00 = local_68;
      iVar7 = JS_IsException(JVar11);
      if (iVar7 == 0) {
        if ((int)uVar5 < 1) goto LAB_001c2b69;
        this_val_00.u._4_4_ = in_stack_fffffffffffffe94;
        this_val_00.u.int32 = in_stack_fffffffffffffe90;
        this_val_00.tag = (int64_t)in_stack_fffffffffffffe98;
        iVar7 = validate_typed_array(in_stack_fffffffffffffe88,this_val_00);
        if ((iVar7 == 0) &&
           (this_val_01.u._4_4_ = in_stack_fffffffffffffe94,
           this_val_01.u.int32 = in_stack_fffffffffffffe90,
           this_val_01.tag = (int64_t)in_stack_fffffffffffffe98,
           iVar7 = validate_typed_array(in_stack_fffffffffffffe88,this_val_01), iVar7 == 0)) {
          this_val_03.u._4_4_ = in_stack_fffffffffffffea4;
          this_val_03.u.int32 = in_stack_fffffffffffffea0;
          this_val_03.tag = (int64_t)in_stack_fffffffffffffea8;
          p_01 = get_typed_array(in_stack_fffffffffffffe98,this_val_03,in_stack_fffffffffffffe94);
          if ((p_01 == (JSObject *)0x0) ||
             ((((p_00->field_0).header.dummy2 != (p_01->field_0).header.dummy2 ||
               (uVar8 = typed_array_get_length(in_RDI,p_01), uVar8 < uVar5)) ||
              (uVar8 = typed_array_get_length(in_RDI,p_00),
              uVar8 < in_stack_ffffffffffffff0c + uVar5)))) {
            iVar7 = 0;
            while (iVar7 < (int)uVar5) {
              this_obj.tag = (int64_t)JVar16.ptr;
              this_obj.u.ptr = ctx_00.ptr;
              prop.tag._0_4_ = uVar15;
              prop.u = (JSValueUnion)uVar14;
              prop.tag._4_4_ = iVar2;
              JVar11 = JS_GetPropertyValue((JSContext *)CONCAT44(in_stack_fffffffffffffec4,uVar13),
                                           this_obj,prop);
              pJVar12 = (JSContext *)JVar11.tag;
              iVar9 = JS_IsException(JVar11);
              if ((iVar9 != 0) ||
                 (this_obj_00.u._4_4_ = in_stack_fffffffffffffef4, this_obj_00.u.int32 = uVar18,
                 this_obj_00.tag = iVar19, prop_00.tag = iVar17, prop_00.u.ptr = JVar16.ptr,
                 val_02.u._4_4_ = iVar7, val_02.u.int32 = iVar3, val_02.tag = (int64_t)p_01,
                 in_stack_fffffffffffffe94 = iStack_4c, iVar9 = iVar7,
                 iVar10 = JS_SetPropertyValue((JSContext *)ctx_00.ptr,this_obj_00,prop_00,val_02,
                                              iVar2), in_stack_fffffffffffffe80 = pJVar12,
                 in_stack_fffffffffffffe90 = iVar7, iVar10 < 0)) goto LAB_001c2b35;
              iVar7 = iVar9 + 1;
            }
          }
          else {
            memcpy((p_01->u).func.var_refs,
                   (void *)((long)(p_00->u).func.var_refs +
                           (long)(in_stack_ffffffffffffff0c << (bVar20 & 0x1f))),
                   (long)(int)(uVar5 << (bVar20 & 0x1f)));
          }
          goto LAB_001c2b69;
        }
      }
    }
  }
LAB_001c2b35:
  v.tag._0_4_ = in_stack_fffffffffffffe90;
  v.u = (JSValueUnion)in_stack_fffffffffffffe88;
  v.tag._4_4_ = in_stack_fffffffffffffe94;
  JS_FreeValue(in_stack_fffffffffffffe80,v);
  local_70 = 0;
  local_68.float64 = 2.96439387504748e-323;
  iVar4 = iStack_6c;
LAB_001c2b69:
  iStack_6c = iVar4;
  JVar1.u._4_4_ = iStack_6c;
  JVar1.u.int32 = local_70;
  JVar1.tag = (int64_t)local_68.ptr;
  return JVar1;
}

Assistant:

static JSValue js_typed_array_slice(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst args[2];
    JSValue arr, val;
    JSObject *p, *p1;
    int n, len, start, final, count, shift;

    arr = JS_UNDEFINED;
    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;

    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;
    final = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[1], 0, len, len))
            goto exception;
    }
    count = max_int(final - start, 0);

    p = get_typed_array(ctx, this_val, 0);
    if (p == NULL)
        goto exception;
    shift = typed_array_size_log2(p->class_id);

    args[0] = this_val;
    args[1] = JS_NewInt32(ctx, count);
    arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
    if (JS_IsException(arr))
        goto exception;

    if (count > 0) {
        if (validate_typed_array(ctx, this_val)
        ||  validate_typed_array(ctx, arr))
            goto exception;

        p1 = get_typed_array(ctx, arr, 0);
        if (p1 != NULL && p->class_id == p1->class_id &&
            typed_array_get_length(ctx, p1) >= count &&
            typed_array_get_length(ctx, p) >= start + count) {
            memcpy(p1->u.array.u.uint8_ptr,
                   p->u.array.u.uint8_ptr + (start << shift),
                   count << shift);
        } else {
            for (n = 0; n < count; n++) {
                val = JS_GetPropertyValue(ctx, this_val, JS_NewInt32(ctx, start + n));
                if (JS_IsException(val))
                    goto exception;
                if (JS_SetPropertyValue(ctx, arr, JS_NewInt32(ctx, n), val,
                                        JS_PROP_THROW) < 0)
                    goto exception;
            }
        }
    }
    return arr;

 exception:
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}